

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int GetSubRect(WebPPicture *prev_canvas,WebPPicture *curr_canvas,int is_key_frame,int is_first_frame
              ,int empty_rect_allowed,int is_lossless,float quality,FrameRectangle *rect,
              WebPPicture *sub_frame)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  undefined4 in_R9D;
  int in_XMM0_Da;
  undefined4 in_stack_00000008;
  FrameRectangle *in_stack_00000030;
  WebPPicture *in_stack_00000038;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  
  if ((in_EDX == 0) || (in_ECX != 0)) {
    MinimizeChangeRectangle
              ((WebPPicture *)rect,in_stack_00000038,in_stack_00000030,prev_canvas._4_4_,
               prev_canvas._0_4_);
  }
  iVar1 = IsEmptyRect((FrameRectangle *)CONCAT44(quality,in_stack_00000008));
  if (iVar1 != 0) {
    if (in_R8D != 0) {
      return 1;
    }
    *(undefined4 *)(CONCAT44(quality,in_stack_00000008) + 8) = 1;
    *(undefined4 *)(CONCAT44(quality,in_stack_00000008) + 0xc) = 1;
  }
  SnapToEvenOffsets((FrameRectangle *)CONCAT44(quality,in_stack_00000008));
  iVar1 = WebPPictureView((WebPPicture *)CONCAT44(in_R8D,in_R9D),in_XMM0_Da,
                          in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8,(WebPPicture *)0x1a299f);
  return iVar1;
}

Assistant:

static int GetSubRect(const WebPPicture* const prev_canvas,
                      const WebPPicture* const curr_canvas, int is_key_frame,
                      int is_first_frame, int empty_rect_allowed,
                      int is_lossless, float quality,
                      FrameRectangle* const rect,
                      WebPPicture* const sub_frame) {
  if (!is_key_frame || is_first_frame) {  // Optimize frame rectangle.
    // Note: This behaves as expected for first frame, as 'prev_canvas' is
    // initialized to a fully transparent canvas in the beginning.
    MinimizeChangeRectangle(prev_canvas, curr_canvas, rect,
                            is_lossless, quality);
  }

  if (IsEmptyRect(rect)) {
    if (empty_rect_allowed) {  // No need to get 'sub_frame'.
      return 1;
    } else {                   // Force a 1x1 rectangle.
      rect->width = 1;
      rect->height = 1;
      assert(rect->x_offset == 0);
      assert(rect->y_offset == 0);
    }
  }

  SnapToEvenOffsets(rect);
  return WebPPictureView(curr_canvas, rect->x_offset, rect->y_offset,
                         rect->width, rect->height, sub_frame);
}